

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  short *psVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  U16 UVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  size_t sVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  byte *pbVar17;
  ushort uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  short sVar22;
  int iVar23;
  long lVar24;
  undefined1 *puVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  U16 nbPerRank [13];
  short sStack_aa;
  uint local_a8 [2];
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  unkbyte10 Stack_58;
  undefined6 local_4e;
  unkbyte10 Stack_48;
  
  sVar10 = 0xffffffffffffffff;
  if (((((ulong)workSpace & 3) == 0) && (sVar10 = 0xffffffffffffffbe, 0x10ff < wkspSize)) &&
     (sVar10 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    uVar33 = (ulong)(maxSymbolValue + 1);
    uVar21 = 0;
    local_60 = tree;
    memset(workSpace,0,0x1100);
    do {
      uVar19 = 0x1f;
      if (count[uVar21] + 1 != 0) {
        for (; count[uVar21] + 1 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      piVar2 = (int *)((long)workSpace + (ulong)uVar19 * 8 + 0x1000);
      *piVar2 = *piVar2 + 1;
      uVar21 = uVar21 + 1;
    } while (uVar33 != uVar21);
    lVar24 = 0x21e;
    do {
      iVar12 = *(int *)((long)workSpace + lVar24 * 8) + *(int *)((long)workSpace + lVar24 * 8 + 8);
      *(int *)((long)workSpace + lVar24 * 8) = iVar12;
      *(int *)((long)workSpace + lVar24 * 8 + 4) = iVar12;
      uVar21 = lVar24 - 0x1ff;
      lVar24 = lVar24 + -1;
    } while (1 < uVar21);
    uVar21 = 0;
    do {
      uVar19 = count[uVar21];
      uVar30 = 0x1f;
      if (uVar19 + 1 != 0) {
        for (; uVar19 + 1 >> uVar30 == 0; uVar30 = uVar30 - 1) {
        }
      }
      uVar26 = (ulong)uVar30;
      uVar30 = *(uint *)((long)workSpace + uVar26 * 8 + 0x100c);
      *(uint *)((long)workSpace + uVar26 * 8 + 0x100c) = uVar30 + 1;
      if (*(uint *)((long)workSpace + uVar26 * 8 + 0x1008) < uVar30) {
        do {
          uVar27 = uVar30 - 1;
          uVar16 = (ulong)uVar27;
          if (uVar19 <= *(uint *)((long)workSpace + uVar16 * 8 + 8)) goto LAB_0066a40c;
          *(undefined8 *)((long)workSpace + (ulong)uVar30 * 8 + 8) =
               *(undefined8 *)((long)workSpace + uVar16 * 8 + 8);
          uVar30 = uVar27;
        } while (*(uint *)((long)workSpace + uVar26 * 8 + 0x1008) < uVar27);
      }
      else {
LAB_0066a40c:
        uVar16 = (ulong)uVar30;
      }
      *(uint *)((long)workSpace + uVar16 * 8 + 8) = uVar19;
      *(char *)((long)workSpace + uVar16 * 8 + 0xe) = (char)uVar21;
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar33);
    local_68 = (ulong)maxSymbolValue;
    lVar24 = (local_68 << 0x20) + 0x100000000;
    lVar29 = 0;
    do {
      iVar12 = *(int *)((long)workSpace + lVar29 * 8 + local_68 * 8 + 8);
      lVar29 = lVar29 + -1;
      lVar24 = lVar24 + -0x100000000;
    } while (iVar12 == 0);
    uVar19 = 0xb;
    if (maxNbBits != 0) {
      uVar19 = maxNbBits;
    }
    uVar26 = local_68 + lVar29 + 1;
    uVar21 = local_68 + lVar29 + 0x100;
    *(int *)((long)workSpace + 0x808) =
         iVar12 + *(int *)((long)workSpace + lVar29 * 8 + local_68 * 8 + 8);
    *(undefined2 *)((long)workSpace + lVar29 * 8 + local_68 * 8 + 0xc) = 0x100;
    *(undefined2 *)((long)workSpace + lVar29 * 8 + local_68 * 8 + 0x14) = 0x100;
    auVar8 = _DAT_006bcbf0;
    auVar7 = _DAT_006a9900;
    auVar6 = _DAT_006a98f0;
    iVar12 = (int)uVar21;
    if ((long)uVar26 < 2) {
      *(undefined4 *)workSpace = 0x80000000;
      *(undefined1 *)((long)workSpace + (long)iVar12 * 8 + 0xf) = 0;
    }
    else {
      uVar35 = (ulong)(maxSymbolValue - 1) + lVar29;
      uVar16 = 0x101;
      if (0x101 < iVar12) {
        uVar16 = uVar21 & 0xffffffff;
      }
      local_70 = local_68 + 0xff + lVar29;
      lVar32 = uVar16 - 0x101;
      auVar36._8_4_ = (int)lVar32;
      auVar36._0_8_ = lVar32;
      auVar36._12_4_ = (int)((ulong)lVar32 >> 0x20);
      uVar31 = 0;
      auVar36 = auVar36 ^ _DAT_006a9900;
      do {
        auVar37._8_4_ = (int)uVar31;
        auVar37._0_8_ = uVar31;
        auVar37._12_4_ = (int)(uVar31 >> 0x20);
        auVar38 = (auVar37 | auVar6) ^ auVar7;
        iVar28 = auVar36._4_4_;
        if ((bool)(~(auVar38._4_4_ == iVar28 && auVar36._0_4_ < auVar38._0_4_ ||
                    iVar28 < auVar38._4_4_) & 1)) {
          *(undefined4 *)((long)workSpace + uVar31 * 8 + 0x810) = 0x40000000;
        }
        if ((auVar38._12_4_ != auVar36._12_4_ || auVar38._8_4_ <= auVar36._8_4_) &&
            auVar38._12_4_ <= auVar36._12_4_) {
          *(undefined4 *)((long)workSpace + uVar31 * 8 + 0x818) = 0x40000000;
        }
        auVar37 = (auVar37 | auVar8) ^ auVar7;
        iVar13 = auVar37._4_4_;
        if (iVar13 <= iVar28 && (iVar13 != iVar28 || auVar37._0_4_ <= auVar36._0_4_)) {
          *(undefined4 *)((long)workSpace + uVar31 * 8 + 0x820) = 0x40000000;
          *(undefined4 *)((long)workSpace + uVar31 * 8 + 0x828) = 0x40000000;
        }
        uVar31 = uVar31 + 4;
      } while ((uVar16 - 0xfd & 0xfffffffffffffffc) != uVar31);
      uVar16 = 0x101;
      if (0x101 < iVar12) {
        uVar16 = uVar21 & 0xffffffff;
      }
      *(undefined4 *)workSpace = 0x80000000;
      iVar28 = 0x100;
      lVar32 = 0;
      do {
        iVar34 = (int)uVar35;
        uVar30 = *(uint *)((long)workSpace + (long)iVar34 * 8 + 8);
        uVar27 = *(uint *)((long)workSpace + (long)iVar28 * 8 + 8);
        iVar13 = (iVar28 + 1) - (uint)(uVar30 < uVar27);
        iVar23 = iVar28;
        if (uVar30 < uVar27) {
          iVar23 = iVar34;
        }
        uVar9 = (uint)(uVar30 < uVar27);
        iVar20 = iVar34 - uVar9;
        uVar30 = *(uint *)((long)workSpace + (long)iVar20 * 8 + 8);
        uVar27 = *(uint *)((long)workSpace + (long)iVar13 * 8 + 8);
        iVar28 = (iVar13 + 1) - (uint)(uVar30 < uVar27);
        uVar35 = (ulong)((iVar34 - uVar9) - (uint)(uVar30 < uVar27));
        if (uVar30 < uVar27) {
          iVar13 = iVar20;
        }
        *(int *)((long)workSpace + lVar32 * 8 + 0x810) =
             *(int *)((long)workSpace + (long)iVar13 * 8 + 8) +
             *(int *)((long)workSpace + (long)iVar23 * 8 + 8);
        sVar22 = (short)lVar32 + 0x101;
        *(short *)((long)workSpace + (long)iVar13 * 8 + 0xc) = sVar22;
        *(short *)((long)workSpace + (long)iVar23 * 8 + 0xc) = sVar22;
        lVar32 = lVar32 + 1;
      } while (uVar16 - 0x100 != lVar32);
      *(undefined1 *)((long)workSpace + (long)iVar12 * 8 + 0xf) = 0;
      pcVar15 = (char *)((long)workSpace + (local_70 & 0xffffffff) * 8 + 0xf);
      do {
        *pcVar15 = *(char *)((long)workSpace + (ulong)*(ushort *)(pcVar15 + -3) * 8 + 0xf) + '\x01';
        uVar30 = (int)uVar21 - 1;
        uVar21 = (ulong)uVar30;
        pcVar15 = pcVar15 + -8;
      } while (0x100 < (int)uVar30);
    }
    uVar21 = local_68 + lVar29 + 2;
    if (-1 < (long)uVar26) {
      uVar16 = 0;
      do {
        *(char *)((long)workSpace + uVar16 * 8 + 0xf) =
             *(char *)((long)workSpace +
                      (ulong)*(ushort *)((long)workSpace + uVar16 * 8 + 0xc) * 8 + 0xf) + '\x01';
        uVar16 = uVar16 + 1;
      } while ((uVar21 & 0xffffffff) != uVar16);
    }
    iVar28 = (int)uVar26;
    bVar3 = *(byte *)((long)workSpace + (uVar26 & 0xffffffff) * 8 + 0xf);
    iVar12 = bVar3 - uVar19;
    uVar30 = (uint)bVar3;
    if (uVar19 <= bVar3 && iVar12 != 0) {
      bVar11 = (byte)iVar12;
      bVar4 = *(byte *)((long)workSpace + (lVar24 >> 0x1d) + 0xf);
      uVar30 = (uint)bVar4;
      if (uVar19 < bVar4) {
        iVar28 = (int)lVar29 + maxSymbolValue + 1;
        puVar25 = (undefined1 *)((long)workSpace + (long)iVar28 * 8 + 0xf);
        lVar24 = (long)iVar28 << 0x20;
        iVar12 = 0;
        do {
          iVar12 = (-1 << (bVar3 - (char)uVar30 & 0x1f)) + iVar12 + (1 << (bVar11 & 0x1f));
          *puVar25 = (char)uVar19;
          uVar30 = (uint)(byte)puVar25[-8];
          puVar25 = puVar25 + -8;
          lVar24 = lVar24 + -0x100000000;
          iVar28 = iVar28 + -1;
        } while (uVar19 < uVar30);
      }
      else {
        iVar12 = 0;
      }
      uVar30 = iVar28 + 1;
      lVar24 = (lVar24 >> 0x20) + 1;
      do {
        lVar29 = lVar24 * 8;
        uVar30 = uVar30 - 1;
        lVar24 = lVar24 + -1;
      } while (uVar19 == *(byte *)((long)workSpace + lVar29 + 7));
      uVar27 = iVar12 >> (bVar11 & 0x1f);
      local_78 = 0xf0f0f0f0f0f0f0f0;
      local_88 = 0xf0f0f0f0f0f0f0f0;
      uStack_80 = 0xf0f0f0f0f0f0f0f0;
      local_98 = 0xf0f0f0f0f0f0f0f0;
      uStack_90 = 0xf0f0;
      uStack_8e = 0xf0f0f0f0f0f0;
      local_a8[0] = 0xf0f0f0f0;
      local_a8[1] = 0xf0f0f0f0;
      uStack_a0 = 0xf0f0;
      uStack_9e = 0xf0f0f0f0f0f0;
      if (-1 < lVar24) {
        uVar16 = (ulong)uVar30;
        pbVar17 = (byte *)((long)workSpace + uVar16 * 8 + 0xf);
        uVar30 = uVar19;
        do {
          uVar9 = (uint)uVar16;
          if (*pbVar17 < uVar30) {
            uVar30 = (uint)*pbVar17;
            local_a8[uVar19 - uVar30] = uVar9;
          }
          uVar16 = uVar16 - 1;
          pbVar17 = pbVar17 + -8;
        } while (0 < (int)uVar9);
      }
      for (; 0 < (int)uVar27; uVar27 = (-1 << ((byte)uVar14 & 0x1f)) + uVar27) {
        uVar30 = 0x1f;
        if (uVar27 != 0) {
          for (; uVar27 >> uVar30 == 0; uVar30 = uVar30 - 1) {
          }
        }
        if ((uVar30 ^ 0x1f) != 0x1f) {
          uVar16 = (ulong)(0x20 - (uVar30 ^ 0x1f));
          do {
            uVar35 = uVar16 - 1;
            if (((ulong)local_a8[uVar16] != 0xf0f0f0f0) &&
               ((local_a8[uVar35 & 0xffffffff] == 0xf0f0f0f0 ||
                (*(uint *)((long)workSpace + (ulong)local_a8[uVar16] * 8 + 8) <=
                 (uint)(*(int *)((long)workSpace + (ulong)local_a8[uVar35 & 0xffffffff] * 8 + 8) * 2
                       ))))) {
              if (0xc < uVar16) goto LAB_0066a8a8;
              goto LAB_0066a886;
            }
            uVar16 = uVar35;
          } while ((uVar35 & 0xfffffffe) != 0);
        }
        uVar16 = 1;
LAB_0066a886:
        do {
          if (local_a8[uVar16] != 0xf0f0f0f0) goto LAB_0066a8a8;
          uVar16 = uVar16 + 1;
        } while (uVar16 != 0xd);
        uVar16 = 0xd;
LAB_0066a8a8:
        uVar14 = (int)uVar16 - 1;
        uVar30 = local_a8[uVar16 & 0xffffffff];
        pcVar15 = (char *)((long)workSpace + (ulong)uVar30 * 8 + 0xf);
        *pcVar15 = *pcVar15 + '\x01';
        uVar9 = local_a8[uVar14];
        if (local_a8[uVar14] == 0xf0f0f0f0) {
          uVar9 = uVar30;
        }
        local_a8[uVar14] = uVar9;
        if ((ulong)uVar30 == 0) {
          uVar30 = 0xf0f0f0f0;
        }
        else {
          uVar30 = uVar30 - 1;
          if (uVar19 - (int)uVar16 != (uint)*(byte *)((long)workSpace + (ulong)uVar30 * 8 + 0xf)) {
            uVar30 = 0xf0f0f0f0;
          }
        }
        local_a8[uVar16 & 0xffffffff] = uVar30;
      }
      uVar30 = uVar19;
      if ((int)uVar27 < 0) {
        do {
          uVar9 = local_a8[1] + 0xf0f0f10;
          uVar14 = 0;
          while( true ) {
            local_a8[1] = local_a8[1] + 1;
            if (uVar9 == uVar14) break;
            pcVar15 = (char *)((long)workSpace + (ulong)local_a8[1] * 8 + 0xf);
            *pcVar15 = *pcVar15 + -1;
            uVar14 = uVar14 - 1;
            if (uVar27 == uVar14) goto LAB_0066a91a;
          }
          iVar12 = (int)lVar24;
          iVar28 = uVar27 - uVar14;
          lVar24 = (long)iVar12 + 1;
          local_a8[1] = iVar12 + 2;
          do {
            lVar29 = lVar24 * 8;
            lVar24 = lVar24 + -1;
            local_a8[1] = local_a8[1] - 1;
          } while (uVar19 == *(byte *)((long)workSpace + lVar29 + 7));
          pcVar15 = (char *)((long)workSpace + (long)(int)local_a8[1] * 8 + 0xf);
          *pcVar15 = *pcVar15 + -1;
          uVar27 = iVar28 + 1;
        } while (iVar28 < -1);
      }
    }
LAB_0066a91a:
    sVar10 = 0xffffffffffffffff;
    if (uVar30 < 0xd) {
      local_98 = 0;
      uStack_90 = 0;
      local_a8[0] = 0;
      local_a8[1] = 0;
      uStack_a0 = 0;
      uStack_9e = 0;
      Stack_48 = SUB1610((undefined1  [16])0x0,6);
      Stack_58 = SUB1610((undefined1  [16])0x0,0);
      local_4e = 0;
      if (-1 < (long)uVar26) {
        uVar26 = 0;
        do {
          psVar1 = (short *)((long)local_a8 +
                            (ulong)*(byte *)((long)workSpace + uVar26 * 8 + 0xf) * 2);
          *psVar1 = *psVar1 + 1;
          uVar26 = uVar26 + 1;
        } while ((uVar21 & 0xffffffff) != uVar26);
      }
      sVar10 = (size_t)uVar30;
      if (uVar30 != 0) {
        uVar21 = sVar10 + 1;
        uVar18 = 0;
        do {
          *(ushort *)((long)&local_60 + uVar21 * 2 + 6) = uVar18;
          uVar18 = (ushort)(uVar18 + (&sStack_aa)[uVar21]) >> 1;
          uVar21 = uVar21 - 1;
        } while (1 < uVar21);
      }
      uVar21 = 0;
      do {
        local_60[*(byte *)((long)workSpace + uVar21 * 8 + 0xe)].nbBits =
             *(BYTE *)((long)workSpace + uVar21 * 8 + 0xf);
        uVar21 = uVar21 + 1;
      } while (uVar33 != uVar21);
      uVar21 = 0;
      do {
        UVar5 = *(U16 *)((long)&Stack_58 + (ulong)local_60[uVar21].nbBits * 2);
        *(U16 *)((long)&Stack_58 + (ulong)local_60[uVar21].nbBits * 2) = UVar5 + 1;
        local_60[uVar21].val = UVar5;
        uVar21 = uVar21 + 1;
      } while (uVar33 != uVar21);
    }
  }
  return sVar10;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables = (HUF_buildCTable_wksp_tables*)workSpace;
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
      return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
      return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(tree, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}